

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplexmain.cpp
# Opt level: O0

void printPrimalSolution<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>>
               (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *soplex,NameSet *colnames,NameSet *rownames,bool real,bool rational)

{
  bool bVar1;
  byte bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  Verbosity VVar5;
  int iVar6;
  element_type *peVar7;
  SPxOut *_spxout;
  SPxOut *manip;
  byte in_CL;
  long in_RDI;
  byte in_R8B;
  Real __x;
  double dVar8;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  int i_3;
  Verbosity old_verbosity_10;
  int nNonzeros_1;
  Verbosity old_verbosity_9;
  Verbosity old_verbosity_8;
  int i_2;
  Verbosity old_verbosity_7;
  VectorRational primal_1;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  Verbosity old_verbosity_4;
  int i_1;
  Verbosity old_verbosity_3;
  int nNonzeros;
  Verbosity old_verbosity_2;
  Verbosity old_verbosity_1;
  int i;
  Verbosity old_verbosity;
  VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  primal;
  int printwidth;
  int printprec;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff918;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff920;
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *in_stack_fffffffffffff928;
  SPxOut *in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff968;
  undefined4 in_stack_fffffffffffff96c;
  int iVar9;
  undefined4 in_stack_fffffffffffff970;
  undefined2 in_stack_fffffffffffff974;
  undefined1 in_stack_fffffffffffff976;
  undefined1 in_stack_fffffffffffff977;
  SPxOut *in_stack_fffffffffffff978;
  undefined7 in_stack_fffffffffffff9b8;
  undefined1 in_stack_fffffffffffff9bf;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *in_stack_fffffffffffff9c0;
  Verbosity local_498;
  Verbosity local_494 [3];
  undefined1 local_488 [68];
  Verbosity local_444;
  Verbosity local_440 [2];
  undefined1 local_438 [72];
  int local_3f0;
  Verbosity local_3ec;
  Verbosity local_3e8;
  int local_3e4;
  Verbosity local_3e0;
  Verbosity local_3dc;
  undefined1 local_3d8 [76];
  int local_38c;
  int local_388;
  Verbosity local_384;
  Verbosity local_380 [2];
  undefined1 local_378 [76];
  int local_32c;
  Verbosity local_328;
  Verbosity local_324 [8];
  Verbosity local_304;
  Verbosity local_300;
  int local_2fc;
  int local_2e4;
  Verbosity local_2e0;
  Verbosity local_2dc;
  undefined1 local_2d8 [80];
  int local_288;
  int local_284;
  Verbosity local_280;
  Verbosity local_27c [6];
  undefined1 local_264 [80];
  int local_214;
  Verbosity local_210;
  Verbosity local_20c;
  int local_208;
  int local_204;
  int local_1ec;
  Verbosity local_1e8;
  Verbosity local_1e4;
  undefined1 local_1e0 [80];
  int local_190;
  int local_18c;
  Verbosity local_188;
  Verbosity local_184 [6];
  undefined1 local_16c [80];
  int local_11c;
  Verbosity local_118;
  Verbosity local_114 [16];
  int local_d4;
  int local_d0;
  byte local_ca;
  byte local_c9;
  long local_b8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_b0;
  undefined1 *local_a8;
  number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
  *local_a0;
  undefined1 *local_98;
  undefined8 local_90;
  undefined8 local_88;
  Verbosity *local_80;
  undefined1 *local_78;
  undefined8 local_70;
  undefined8 local_68;
  Verbosity *local_60;
  undefined1 *local_58;
  Verbosity *local_50;
  Verbosity *local_48;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_40;
  undefined1 *local_38;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_30;
  undefined1 *local_28;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_20;
  undefined1 *local_18;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_10;
  undefined1 *local_8;
  
  local_c9 = in_CL & 1;
  local_ca = in_R8B & 1;
  local_b8 = in_RDI;
  ::soplex::
  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ::tolerances(in_stack_fffffffffffff918);
  peVar7 = std::__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15429f);
  __x = ::soplex::Tolerances::epsilon(peVar7);
  dVar8 = log10(__x);
  local_d0 = (int)-dVar8;
  std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x1542ef);
  local_d4 = local_d0 + 10;
  if ((local_c9 & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x15431b);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  *)in_stack_fffffffffffff930,(int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    bVar1 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRay(in_stack_fffffffffffff928,
                           (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                            *)in_stack_fffffffffffff920);
    if (bVar1) {
      if ((local_b8 != -8) &&
         (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
        local_114[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_118 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_118);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_114);
      }
      for (local_11c = 0; iVar9 = local_11c,
          iVar6 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x15446e), iVar9 < iVar6; local_11c = local_11c + 1) {
        local_40 = ::soplex::
                   VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 *)in_stack_fffffffffffff920,
                                (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
        local_38 = local_16c;
        boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                  ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff920,
                   (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff918);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff918);
        peVar7 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1544f8);
        ::soplex::Tolerances::epsilon(peVar7);
        bVar1 = ::soplex::
                isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                          (in_stack_fffffffffffff9c0,
                           (double)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8));
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x154537)
        ;
        if (((bVar1) && (local_b8 != -8)) &&
           (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
          local_184[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_188 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_188);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff920,
                     (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
          local_18c = (int)std::setw(local_d4);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff918,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
          local_190 = (int)std::setprecision(local_d0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff918,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
          local_30 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff920,
                                  (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
          local_28 = local_1e0;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff920,
                     (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff918);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,
                     (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)in_stack_fffffffffffff918);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff918);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_184);
        }
      }
      if ((local_b8 != -8) &&
         (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
        local_1e4 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_1e8 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_1e8);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
        local_1ec = (int)std::setprecision(1);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff918,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff920,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff918);
        ::soplex::
        SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
        ::tolerances(in_stack_fffffffffffff918);
        peVar7 = std::
                 __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x154870);
        ::soplex::Tolerances::epsilon(peVar7);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff920,(double)in_stack_fffffffffffff918);
        local_204 = (int)std::setprecision(8);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff918,
                   (_Setprecision)(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff920,
                   (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff918);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff920,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff918);
        std::shared_ptr<soplex::Tolerances>::~shared_ptr((shared_ptr<soplex::Tolerances> *)0x154931)
        ;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_1e4);
      }
    }
    else {
      bVar1 = ::soplex::
              SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              ::isPrimalFeasible(in_stack_fffffffffffff920);
      if ((bVar1) &&
         (bVar1 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::getPrimal(in_stack_fffffffffffff928,
                              (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)in_stack_fffffffffffff920), bVar1)) {
        local_208 = 0;
        if ((local_b8 != -8) &&
           (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
          local_20c = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_210 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_210);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_20c);
        }
        for (local_214 = 0; iVar9 = local_214,
            iVar6 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                               *)0x154aa1), iVar9 < iVar6; local_214 = local_214 + 1) {
          local_20 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                   *)in_stack_fffffffffffff920,
                                  (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
          local_18 = local_264;
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                    ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff920,
                     (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff918);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff918);
          peVar7 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x154b2b);
          ::soplex::Tolerances::epsilon(peVar7);
          bVar1 = ::soplex::
                  isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                            (in_stack_fffffffffffff9c0,
                             (double)CONCAT17(in_stack_fffffffffffff9bf,in_stack_fffffffffffff9b8));
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x154b6a);
          if (bVar1) {
            if ((local_b8 != -8) &&
               (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
              local_27c[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
              local_280 = INFO1;
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_280);
              ::soplex::NameSet::operator[]
                        ((NameSet *)in_stack_fffffffffffff920,
                         (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
              local_284 = (int)std::setw(local_d4);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff918,
                         (_Setw)(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
              local_288 = (int)std::setprecision(local_d0);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff918,
                         (_Setprecision)(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
              local_10 = ::soplex::
                         VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                         ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)in_stack_fffffffffffff920,
                                      (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
              local_8 = local_2d8;
              boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float
                        ((cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff920,
                         (cpp_dec_float<100U,_int,_void> *)in_stack_fffffffffffff918);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff920,
                         (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)in_stack_fffffffffffff918);
              ::soplex::operator<<
                        ((SPxOut *)in_stack_fffffffffffff920,
                         (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff918);
              ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_27c);
            }
            local_208 = local_208 + 1;
          }
        }
        if ((local_b8 != -8) &&
           (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
          local_2dc = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_2e0 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_2e0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
          local_2e4 = (int)std::setprecision(1);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff918,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff918);
          ::soplex::
          SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          ::tolerances(in_stack_fffffffffffff918);
          peVar7 = std::
                   __shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x154eb2);
          ::soplex::Tolerances::epsilon(peVar7);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,(double)in_stack_fffffffffffff918);
          local_2fc = (int)std::setprecision(8);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff918,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,
                     (_func_ios_base_ptr_ios_base_ptr *)in_stack_fffffffffffff918);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,
                     (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff918);
          std::shared_ptr<soplex::Tolerances>::~shared_ptr
                    ((shared_ptr<soplex::Tolerances> *)0x154faf);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_2dc);
        }
      }
      else if ((local_b8 != -8) &&
              (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
        local_300 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_304 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_304);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_300);
      }
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   *)0x1550ab);
  }
  if ((local_ca & 1) != 0) {
    ::soplex::
    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)0x1550da);
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                  *)in_stack_fffffffffffff930,(int)((ulong)in_stack_fffffffffffff928 >> 0x20));
    bVar1 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::getPrimalRayRational
                      (in_stack_fffffffffffff928,
                       (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                        *)in_stack_fffffffffffff920);
    if (bVar1) {
      if ((local_b8 != -8) &&
         (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
        local_324[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_328 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_328);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_324);
      }
      for (local_32c = 0; iVar9 = local_32c,
          iVar6 = ::soplex::
                  SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                  ::numCols((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                             *)0x155207), iVar9 < iVar6; local_32c = local_32c + 1) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20));
        local_380[1] = 0;
        local_78 = local_378;
        local_80 = local_380 + 1;
        local_88 = 0;
        local_90 = 0;
        local_48 = local_80;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff978,
                   (longlong *)
                   CONCAT17(in_stack_fffffffffffff977,
                            CONCAT16(in_stack_fffffffffffff976,
                                     CONCAT24(in_stack_fffffffffffff974,in_stack_fffffffffffff970)))
                   ,(type *)CONCAT44(in_stack_fffffffffffff96c,in_stack_fffffffffffff968));
        bVar2 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff918,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x1552ce);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1552e4);
        if ((((bVar2 & 1) != 0) && (local_b8 != -8)) &&
           (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
          local_380[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
          local_384 = INFO1;
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_384);
          ::soplex::NameSet::operator[]
                    ((NameSet *)in_stack_fffffffffffff920,
                     (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
          local_388 = (int)std::setw(local_d4);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff918,
                     (_Setw)(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
          local_38c = (int)std::setprecision(local_d0);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff918,
                     (_Setprecision)(int)((ulong)in_stack_fffffffffffff920 >> 0x20));
          local_b0 = ::soplex::
                     VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                     ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                   *)in_stack_fffffffffffff920,
                                  (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
          local_a8 = local_3d8;
          boost::multiprecision::backends::
          rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
          ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff930,
                             (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                              *)in_stack_fffffffffffff928);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,
                     (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                      *)in_stack_fffffffffffff918);
          ::soplex::operator<<
                    ((SPxOut *)in_stack_fffffffffffff920,
                     (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff918);
          boost::multiprecision::
          number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
          ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                     *)0x1554ac);
          ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_380);
        }
      }
      if ((local_b8 != -8) &&
         (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
        local_3dc = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_3e0 = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_3e0);
        in_stack_fffffffffffff978 =
             ::soplex::operator<<
                       ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
        ::soplex::operator<<
                  ((SPxOut *)in_stack_fffffffffffff920,
                   (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff918);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_3dc);
      }
    }
    uVar3 = ::soplex::
            SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ::isPrimalFeasible(in_stack_fffffffffffff920);
    if (((bool)uVar3) &&
       (uVar4 = ::soplex::
                SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                ::getPrimalRational(in_stack_fffffffffffff928,
                                    (VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff920), (bool)uVar4)) {
      local_3e4 = 0;
      if ((local_b8 != -8) &&
         (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
        local_3e8 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_3ec = INFO1;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_3ec);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_3e8);
      }
      local_3f0 = 0;
      while (iVar9 = local_3f0,
            iVar6 = ::soplex::
                    SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    ::numColsRational((SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                       *)0x155709), iVar9 < iVar6) {
        ::soplex::
        VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
        ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                      *)in_stack_fffffffffffff920,(int)((ulong)in_stack_fffffffffffff918 >> 0x20));
        local_440[1] = 0;
        local_58 = local_438;
        local_60 = local_440 + 1;
        local_68 = 0;
        local_70 = 0;
        local_50 = local_60;
        boost::multiprecision::backends::
        rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
        ::rational_adaptor<long_long>
                  ((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                    *)in_stack_fffffffffffff978,
                   (longlong *)
                   CONCAT17(uVar3,CONCAT16(uVar4,CONCAT24(in_stack_fffffffffffff974,iVar6))),
                   (type *)CONCAT44(iVar9,in_stack_fffffffffffff968));
        bVar1 = boost::multiprecision::operator!=
                          ((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)in_stack_fffffffffffff918,
                           (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                            *)0x1557c1);
        boost::multiprecision::
        number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
        ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                   *)0x1557d4);
        if (bVar1) {
          if ((local_b8 != -8) &&
             (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
            local_440[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
            local_444 = INFO1;
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_444);
            ::soplex::NameSet::operator[]
                      ((NameSet *)in_stack_fffffffffffff920,
                       (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
            local_a0 = ::soplex::
                       VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                       ::operator[]((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                                     *)in_stack_fffffffffffff920,
                                    (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
            local_98 = local_488;
            boost::multiprecision::backends::
            rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
            ::rational_adaptor((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)in_stack_fffffffffffff930,
                               (rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>
                                *)in_stack_fffffffffffff928);
            in_stack_fffffffffffff930 =
                 ::soplex::operator<<
                           ((SPxOut *)in_stack_fffffffffffff920,
                            (number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                             *)in_stack_fffffffffffff918);
            ::soplex::operator<<
                      ((SPxOut *)in_stack_fffffffffffff920,
                       (_func_ostream_ptr_ostream_ptr *)in_stack_fffffffffffff918);
            boost::multiprecision::
            number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
            ::~number((number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>
                       *)0x15592b);
            ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_440);
          }
          local_3e4 = local_3e4 + 1;
        }
        local_3f0 = local_3f0 + 1;
      }
      if ((local_b8 != -8) &&
         (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
        local_494[2] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
        local_494[1] = 3;
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_494 + 1);
        ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
        _spxout = ::soplex::operator<<
                            ((SPxOut *)in_stack_fffffffffffff920,
                             (int)((ulong)in_stack_fffffffffffff918 >> 0x20));
        manip = ::soplex::operator<<(_spxout,(char *)in_stack_fffffffffffff918);
        ::soplex::operator<<(_spxout,(_func_ostream_ptr_ostream_ptr *)manip);
        ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_494 + 2);
      }
    }
    else if ((local_b8 != -8) &&
            (VVar5 = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8)), 2 < (int)VVar5)) {
      local_494[0] = ::soplex::SPxOut::getVerbosity((SPxOut *)(local_b8 + 8));
      local_498 = INFO1;
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),&local_498);
      ::soplex::operator<<((SPxOut *)in_stack_fffffffffffff920,(char *)in_stack_fffffffffffff918);
      ::soplex::SPxOut::setVerbosity((SPxOut *)(local_b8 + 8),local_494);
    }
    ::soplex::
    VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
    ::~VectorBase((VectorBase<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>
                   *)0x155b61);
  }
  return;
}

Assistant:

static
void printPrimalSolution(SoPlexBase<R>& soplex, NameSet& colnames, NameSet& rownames,
                         bool real = true, bool rational = false)
{
   int printprec;
   int printwidth;
   printprec = (int) - log10(Real(soplex.tolerances()->epsilon()));
   printwidth = printprec + 10;

   if(real)
   {
      VectorBase<R> primal(soplex.numCols());

      if(soplex.getPrimalRay(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << ")." << std::endl;)
      }
      else if(soplex.isPrimalFeasible() && soplex.getPrimal(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(isNotZero(primal[i], soplex.tolerances()->epsilon()))
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero (within "
                       << std::setprecision(1) << std::scientific << soplex.tolerances()->epsilon()
                       << std::setprecision(8) << std::fixed
                       << "). Solution has " << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal information available.\n")
      }

   if(rational)
   {
      VectorRational primal(soplex.numCols());

      if(soplex.getPrimalRayRational(primal))
      {
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal ray (name, value):\n";)

         for(int i = 0; i < soplex.numCols(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t"
                             << std::setw(printwidth) << std::setprecision(printprec)
                             << primal[i] << std::endl;)
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other entries are zero." << std::endl;)
      }

      if(soplex.isPrimalFeasible() && soplex.getPrimalRational(primal))
      {
         int nNonzeros = 0;
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "\nPrimal solution (name, value):\n";)

         for(int i = 0; i < soplex.numColsRational(); ++i)
         {
            if(primal[i] != (Rational) 0)
            {
               SPX_MSG_INFO1(soplex.spxout, soplex.spxout << colnames[i] << "\t" << primal[i] << std::endl;)
               ++nNonzeros;
            }
         }

         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "All other variables are zero. Solution has "
                       << nNonzeros << " nonzero entries." << std::endl;)
      }
      else
         SPX_MSG_INFO1(soplex.spxout, soplex.spxout << "No primal (rational) solution available.\n")

      }
}